

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertorsTestCase.cpp
# Opt level: O0

void __thiscall
SuiteFieldConvertorsTests::TestutcTimeOnlyConvertFromMicro::RunImpl
          (TestutcTimeOnlyConvertFromMicro *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_160;
  int local_140 [10];
  TestDetails local_118;
  int local_f8 [10];
  TestDetails local_d0;
  int local_b0 [10];
  TestDetails local_88;
  int local_64 [6];
  allocator<char> local_49;
  string local_48;
  undefined1 local_28 [8];
  UtcTimeOnly result;
  TestutcTimeOnlyConvertFromMicro *this_local;
  
  result.super_DateTime.m_time = (int64_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"12:05:06.555555",&local_49);
  FIX::UtcTimeOnlyConvertor::convert((UtcTimeOnly *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_64[1] = 0xc;
  local_64[0] = FIX::DateTime::getHour((DateTime *)local_28);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_88,*ppTVar3,0x1a3);
  UnitTest::CheckEqual<int,int>(pTVar1,local_64 + 1,local_64,&local_88);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_b0[1] = 5;
  local_b0[0] = FIX::DateTime::getMinute((DateTime *)local_28);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_d0,*ppTVar3,0x1a4);
  UnitTest::CheckEqual<int,int>(pTVar1,local_b0 + 1,local_b0,&local_d0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_f8[1] = 6;
  local_f8[0] = FIX::DateTime::getSecond((DateTime *)local_28);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_118,*ppTVar3,0x1a5);
  UnitTest::CheckEqual<int,int>(pTVar1,local_f8 + 1,local_f8,&local_118);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_140[1] = 0x87a23;
  local_140[0] = FIX::DateTime::getFraction((DateTime *)local_28,6);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_160,*ppTVar3,0x1a6);
  UnitTest::CheckEqual<int,int>(pTVar1,local_140 + 1,local_140,&local_160);
  FIX::UtcTimeOnly::~UtcTimeOnly((UtcTimeOnly *)local_28);
  return;
}

Assistant:

TEST(utcTimeOnlyConvertFromMicro)
{
  UtcTimeOnly result = UtcTimeOnlyConvertor::convert
                       ( std::string( "12:05:06.555555" ) );
  CHECK_EQUAL( 12, result.getHour() );
  CHECK_EQUAL( 5, result.getMinute() );
  CHECK_EQUAL( 6, result.getSecond() );
  CHECK_EQUAL( 555555, result.getFraction(6) );
}